

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flags.c
# Opt level: O1

void do_flag(CHAR_DATA *ch,char *argument)

{
  ulong *puVar1;
  byte bVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  byte *argument_00;
  CHAR_DATA *ch_00;
  OBJ_DATA *pOVar7;
  char *argument_01;
  ulong uVar8;
  int iVar9;
  flag_type *flag_table;
  long *plVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  char arg3 [4608];
  char arg1 [4608];
  char word [4608];
  char arg2 [4608];
  long *local_4848;
  char local_4838 [4608];
  char local_3638 [4608];
  char local_2438 [4608];
  char local_1238 [4616];
  
  pcVar6 = one_argument(argument,local_3638);
  pcVar6 = one_argument(pcVar6,local_1238);
  argument_00 = (byte *)one_argument(pcVar6,local_4838);
  bVar2 = *argument_00;
  if (((ulong)bVar2 < 0x3e) && ((0x2000280000000000U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
    argument_00 = (byte *)one_argument((char *)argument_00,local_2438);
  }
  if (local_3638[0] != '\0') {
    if (local_1238[0] == '\0') {
      pcVar6 = "What do you wish to set flags on?\n\r";
      goto LAB_002a0c90;
    }
    if (local_4838[0] == '\0') {
      pcVar6 = "You need to specify a flag to set.\n\r";
      goto LAB_002a0c90;
    }
    if (*argument_00 == 0) {
      pcVar6 = "Which flags do you wish to change?\n\r";
      goto LAB_002a0c90;
    }
    bVar4 = str_prefix(local_3638,"mob");
    if ((!bVar4) || (bVar4 = str_prefix(local_3638,"char"), !bVar4)) {
      ch_00 = get_char_world(ch,local_1238);
      if (ch_00 == (CHAR_DATA *)0x0) {
        pcVar6 = "You can\'t find them.\n\r";
        goto LAB_002a0c90;
      }
      bVar4 = str_prefix(local_4838,"act");
      if (!bVar4) {
        bVar4 = is_npc(ch_00);
        if (bVar4) {
          local_4848 = ch_00->act;
          flag_table = act_flags;
          goto LAB_002a0cf9;
        }
        pcVar6 = "Use plr for PCs.\n\r";
        goto LAB_002a0c90;
      }
      bVar4 = str_prefix(local_4838,"plr");
      if (!bVar4) {
        bVar4 = is_npc(ch_00);
        if (bVar4) {
          pcVar6 = "Use act for NPCs.\n\r";
          goto LAB_002a0c90;
        }
        local_4848 = ch_00->act;
        flag_table = plr_flags;
        goto LAB_002a0cf9;
      }
      bVar4 = str_prefix(local_4838,"aff");
      if (!bVar4) {
        local_4848 = ch_00->affected_by;
        flag_table = affect_flags;
        goto LAB_002a0cf9;
      }
      bVar4 = str_prefix(local_4838,"immunity");
      if (bVar4) {
        bVar4 = str_prefix(local_4838,"resist");
        if (bVar4) {
          bVar4 = str_prefix(local_4838,"vuln");
          if (bVar4) {
            bVar4 = str_prefix(local_4838,"off");
            if (!bVar4) {
              bVar4 = is_npc(ch_00);
              if (bVar4) {
                local_4848 = ch_00->off_flags;
                flag_table = off_flags;
                goto LAB_002a0cf9;
              }
              pcVar6 = "OFF can\'t be set on PCs.\n\r";
              goto LAB_002a0c90;
            }
            bVar4 = str_prefix(local_4838,"form");
            if (!bVar4) {
              bVar4 = is_npc(ch_00);
              if (bVar4) {
                local_4848 = ch_00->form;
                flag_table = form_flags;
                goto LAB_002a0cf9;
              }
              pcVar6 = "Form can\'t be set on PCs.\n\r";
              goto LAB_002a0c90;
            }
            bVar4 = str_prefix(local_4838,"parts");
            if (!bVar4) {
              bVar4 = is_npc(ch_00);
              if (bVar4) {
                local_4848 = ch_00->parts;
                flag_table = part_flags;
                goto LAB_002a0cf9;
              }
              pcVar6 = "Parts can\'t be set on PCs.\n\r";
              goto LAB_002a0c90;
            }
            bVar4 = str_prefix(local_4838,"comm");
            if (!bVar4) {
              bVar4 = is_npc(ch_00);
              if (!bVar4) {
                local_4848 = ch_00->comm;
                flag_table = comm_flags;
                goto LAB_002a0cf9;
              }
              pcVar6 = "Comm can\'t be set on NPCs.\n\r";
              goto LAB_002a0c90;
            }
            goto LAB_002a0c37;
          }
          local_4848 = ch_00->vuln_flags;
        }
        else {
          local_4848 = ch_00->res_flags;
        }
      }
      else {
        local_4848 = ch_00->imm_flags;
      }
      flag_table = imm_flags;
LAB_002a0cf9:
      argument_01 = one_argument((char *)argument_00,local_2438);
      if (local_2438[0] == '\0') {
        uVar11 = 0xffffffffffffff9d;
      }
      else {
        pcVar6 = "That flag doesn\'t exist!\n\r";
        do {
          iVar5 = flag_lookup(local_2438,flag_table);
          if (iVar5 == -99) goto LAB_002a0c90;
          argument_01 = one_argument(argument_01,local_2438);
        } while (local_2438[0] != '\0');
        uVar11 = (ulong)iVar5;
      }
      if (flag_table->name == (char *)0x0) {
        return;
      }
      plVar10 = &flag_table->bit;
      do {
        iVar5 = get_trust(ch);
        if (((iVar5 == 0x3c) || (*(bool *)(plVar10 + 1) == true)) &&
           (uVar3 = *plVar10, uVar3 == uVar11)) {
          if (bVar2 == 0x3d) {
code_r0x002a0dc0:
            dVar12 = exp2((double)((long)uVar3 % 0x20));
            iVar5 = (int)*plVar10;
            iVar9 = iVar5 + 0x1f;
            if (-1 < iVar5) {
              iVar9 = iVar5;
            }
            local_4848[iVar9 >> 5] = local_4848[iVar9 >> 5] | (long)dVar12;
            pcVar6 = "You set that flag.\n\r";
          }
          else if (bVar2 == 0x2d) {
            dVar12 = exp2((double)((long)uVar3 % 0x20));
            uVar3 = *plVar10;
            uVar8 = uVar3 + 0x1f;
            if (-1 < (long)uVar3) {
              uVar8 = uVar3;
            }
            local_4848[(long)uVar8 >> 5] = local_4848[(long)uVar8 >> 5] & ~(long)dVar12;
            pcVar6 = "You removed that flag.\n\r";
          }
          else {
            if (bVar2 == 0x2b) goto code_r0x002a0dc0;
            uVar8 = uVar3 + 0x1f;
            if (-1 < (long)uVar3) {
              uVar8 = uVar3;
            }
            uVar8 = local_4848[(int)(uVar8 >> 5)];
            dVar12 = exp2((double)((long)uVar3 % 0x20));
            dVar13 = exp2((double)(*plVar10 % 0x20));
            if ((uVar8 & (long)dVar12) == 0) {
              iVar5 = (int)*plVar10;
              iVar9 = iVar5 + 0x1f;
              if (-1 < iVar5) {
                iVar9 = iVar5;
              }
              local_4848[iVar9 >> 5] = local_4848[iVar9 >> 5] | (long)dVar13;
              pcVar6 = "You set that flag.\n\r";
            }
            else {
              uVar3 = *plVar10;
              uVar8 = uVar3 + 0x1f;
              if (-1 < (long)uVar3) {
                uVar8 = uVar3;
              }
              local_4848[(long)uVar8 >> 5] = local_4848[(long)uVar8 >> 5] & ~(long)dVar13;
              pcVar6 = "You removed that flag.\n\r";
            }
          }
          send_to_char(pcVar6,ch);
        }
        puVar1 = (ulong *)(plVar10 + 2);
        plVar10 = plVar10 + 3;
        if (*puVar1 == 0) {
          return;
        }
      } while( true );
    }
    bVar4 = str_prefix(local_3638,"obj");
    if (!bVar4) {
      pOVar7 = get_obj_world(ch,local_1238);
      if (pOVar7 == (OBJ_DATA *)0x0) {
        pcVar6 = "Nothing like that anywhere.\n\r";
        goto LAB_002a0c90;
      }
      bVar4 = str_prefix(local_4838,"wear");
      if (!bVar4) {
        local_4848 = pOVar7->wear_flags;
        flag_table = wear_flags;
        goto LAB_002a0cf9;
      }
      bVar4 = str_prefix(local_4838,"extra");
      if (!bVar4) {
        local_4848 = pOVar7->extra_flags;
        flag_table = extra_flags;
        goto LAB_002a0cf9;
      }
LAB_002a0c37:
      pcVar6 = "That\'s not an acceptable flag.\n\r";
      goto LAB_002a0c90;
    }
  }
  send_to_char("Syntax:\n\r",ch);
  send_to_char("  flag mob  <name> <field> <+/-/=> <flags>\n\r",ch);
  send_to_char("  flag char <name> <field> <+/-/=> <flags>\n\r",ch);
  send_to_char("  flag obj  <name> <field> <+/-/=> <flags>\n\r",ch);
  send_to_char("  mob  flags: act,aff,off,imm,res,vuln,form,part\n\r",ch);
  send_to_char("  char flags: plr,comm,aff,imm,res,vuln\n\r",ch);
  send_to_char("  obj flags:  wear,extra\n\r",ch);
  send_to_char("  +: add flag, -: remove flag, = set equal to\n\r",ch);
  pcVar6 = "  otherwise flag toggles the flags listed.\n\r";
LAB_002a0c90:
  send_to_char(pcVar6,ch);
  return;
}

Assistant:

void do_flag(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH], arg2[MAX_INPUT_LENGTH], arg3[MAX_INPUT_LENGTH];
	char word[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	OBJ_DATA *obj;
	long *flag = 0;
	long pos, pos2 = NO_FLAG;
	char type;
	const struct flag_type *flag_table;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);
	argument = one_argument(argument, arg3);

	type = argument[0];

	if (type == '=' || type == '-' || type == '+')
		argument = one_argument(argument, word);

	if (arg1[0] == '\0')
	{
		send_to_char("Syntax:\n\r", ch);
		send_to_char("  flag mob  <name> <field> <+/-/=> <flags>\n\r", ch);
		send_to_char("  flag char <name> <field> <+/-/=> <flags>\n\r", ch);
		send_to_char("  flag obj  <name> <field> <+/-/=> <flags>\n\r", ch);
		send_to_char("  mob  flags: act,aff,off,imm,res,vuln,form,part\n\r", ch);
		send_to_char("  char flags: plr,comm,aff,imm,res,vuln\n\r", ch);
		send_to_char("  obj flags:  wear,extra\n\r", ch);
		send_to_char("  +: add flag, -: remove flag, = set equal to\n\r", ch);
		send_to_char("  otherwise flag toggles the flags listed.\n\r", ch);
		return;
	}

	if (arg2[0] == '\0')
	{
		send_to_char("What do you wish to set flags on?\n\r", ch);
		return;
	}

	if (arg3[0] == '\0')
	{
		send_to_char("You need to specify a flag to set.\n\r", ch);
		return;
	}

	if (argument[0] == '\0')
	{
		send_to_char("Which flags do you wish to change?\n\r", ch);
		return;
	}

	if (!str_prefix(arg1, "mob") || !str_prefix(arg1, "char"))
	{
		victim = get_char_world(ch, arg2);
		if (victim == nullptr)
		{
			send_to_char("You can't find them.\n\r", ch);
			return;
		}

		/* select a flag to set */
		if (!str_prefix(arg3, "act"))
		{
			if (!is_npc(victim))
			{
				send_to_char("Use plr for PCs.\n\r", ch);
				return;
			}

			flag = &victim->act[0];
			flag_table = act_flags;
		}
		else if (!str_prefix(arg3, "plr"))
		{
			if (is_npc(victim))
			{
				send_to_char("Use act for NPCs.\n\r", ch);
				return;
			}

			flag = &victim->act[0];
			flag_table = plr_flags;
		}
		else if (!str_prefix(arg3, "aff"))
		{
			flag = &victim->affected_by[0];
			flag_table = affect_flags;
		}
		else if (!str_prefix(arg3, "immunity"))
		{
			flag = &victim->imm_flags[0];
			flag_table = imm_flags;
		}
		else if (!str_prefix(arg3, "resist"))
		{
			flag = &victim->res_flags[0];
			flag_table = imm_flags;
		}
		else if (!str_prefix(arg3, "vuln"))
		{
			flag = &victim->vuln_flags[0];
			flag_table = imm_flags;
		}
		else if (!str_prefix(arg3, "off"))
		{
			if (!is_npc(victim))
			{
				send_to_char("OFF can't be set on PCs.\n\r", ch);
				return;
			}

			flag = &victim->off_flags[0];
			flag_table = off_flags;
		}
		else if (!str_prefix(arg3, "form"))
		{
			if (!is_npc(victim))
			{
				send_to_char("Form can't be set on PCs.\n\r", ch);
				return;
			}

			flag = &victim->form[0];
			flag_table = form_flags;
		}
		else if (!str_prefix(arg3, "parts"))
		{
			if (!is_npc(victim))
			{
				send_to_char("Parts can't be set on PCs.\n\r", ch);
				return;
			}

			flag = &victim->parts[0];
			flag_table = part_flags;
		}
		else if (!str_prefix(arg3, "comm"))
		{
			if (is_npc(victim))
			{
				send_to_char("Comm can't be set on NPCs.\n\r", ch);
				return;
			}
			flag = &victim->comm[0];
			flag_table = comm_flags;
		}
		else
		{
			send_to_char("That's not an acceptable flag.\n\r", ch);
			return;
		}
	}
	else if (!str_prefix(arg1, "obj"))
	{
		if ((obj = get_obj_world(ch, arg2)) == nullptr)
		{
			send_to_char("Nothing like that anywhere.\n\r", ch);
			return;
		}

		/* select a flag to set */
		if (!str_prefix(arg3, "wear"))
		{
			flag = &obj->wear_flags[0];
			flag_table = wear_flags;
		}
		else if (!str_prefix(arg3, "extra"))
		{
			flag = &obj->extra_flags[0];
			flag_table = extra_flags;
		}
		else
		{
			send_to_char("That's not an acceptable flag.\n\r", ch);
			return;
		}
	}
	else
	{
		send_to_char("Syntax:\n\r", ch);
		send_to_char("  flag mob  <name> <field> <+/-/=> <flags>\n\r", ch);
		send_to_char("  flag char <name> <field> <+/-/=> <flags>\n\r", ch);
		send_to_char("  flag obj  <name> <field> <+/-/=> <flags>\n\r", ch);
		send_to_char("  mob  flags: act,aff,off,imm,res,vuln,form,part\n\r", ch);
		send_to_char("  char flags: plr,comm,aff,imm,res,vuln\n\r", ch);
		send_to_char("  obj flags:  wear,extra\n\r", ch);
		send_to_char("  +: add flag, -: remove flag, = set equal to\n\r", ch);
		send_to_char("  otherwise flag toggles the flags listed.\n\r", ch);
		return;
	}

	/* mark the words */
	for (;;)
	{
		argument = one_argument(argument, word);

		if (word[0] == '\0')
			break;

		pos2 = flag_lookup(word, flag_table);

		if (pos2 == NO_FLAG)
		{
			send_to_char("That flag doesn't exist!\n\r", ch);
			return;
		}
	}

	for (pos = 0; flag_table[pos].name != nullptr; pos++)
	{
		if ((get_trust(ch) == MAX_LEVEL || flag_table[pos].settable) && flag_table[pos].bit == pos2)
		{
			switch (type)
			{
				case '=':
				case '+':
					SET_BIT(flag, flag_table[pos].bit);
					send_to_char("You set that flag.\n\r", ch);
					break;
				case '-':
					REMOVE_BIT(flag, flag_table[pos].bit);
					send_to_char("You removed that flag.\n\r", ch);
					break;
				default:
					if (IS_SET(flag, flag_table[pos].bit))
					{
						REMOVE_BIT(flag, flag_table[pos].bit);
						send_to_char("You removed that flag.\n\r", ch);
					}
					else
					{
						SET_BIT(flag, flag_table[pos].bit);
						send_to_char("You set that flag.\n\r", ch);
					}
			}
		}
		else
		{
			continue;
		}
	}
}